

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupPermFlopGap(Gia_Man_t *p,Vec_Int_t *vFfMask)

{
  int iVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  Gia_Man_t *p_01;
  Gia_Man_t *pGVar3;
  int iVar4;
  long lVar5;
  
  iVar1 = vFfMask->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar4;
  if (iVar4 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar4 << 2);
  }
  p_00->pArray = piVar2;
  if (0 < iVar1) {
    lVar5 = 0;
    do {
      if (vFfMask->pArray[lVar5] != -1) {
        Vec_IntPush(p_00,vFfMask->pArray[lVar5]);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < vFfMask->nSize);
  }
  p_01 = Gia_ManDupPermFlop(p,p_00);
  pGVar3 = Gia_ManDupSpreadFlop(p_01,vFfMask);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  Gia_ManStop(p_01);
  return pGVar3;
}

Assistant:

Gia_Man_t * Gia_ManDupPermFlopGap( Gia_Man_t * p, Vec_Int_t * vFfMask )
{
    Vec_Int_t * vPerm = Vec_IntCondense( vFfMask, -1 );
    Gia_Man_t * pPerm = Gia_ManDupPermFlop( p, vPerm );
    Gia_Man_t * pSpread = Gia_ManDupSpreadFlop( pPerm, vFfMask );
    Vec_IntFree( vPerm );
    Gia_ManStop( pPerm );
    return pSpread;
}